

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O3

void gtk_round_up_box(int x,int y,int w,int h,Fl_Color c)

{
  uint uVar1;
  uint uVar2;
  Fl_Color FVar3;
  _func_int **pp_Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar4;
  
  Fl::set_box_color(c);
  if (w < 5) {
    uVar1 = (w - (w + -1 >> 0x1f)) - 1;
    iVar7 = (int)uVar1 >> 1;
    uVar1 = uVar1 & 0xfffffffe;
  }
  else {
    iVar7 = 2;
    uVar1 = 4;
  }
  if (h <= (int)uVar1) {
    uVar1 = (h - (h + -1 >> 0x1f)) - 1;
    iVar7 = (int)uVar1 >> 1;
    uVar1 = uVar1 & 0xfffffffe;
  }
  uVar9 = w - uVar1;
  uVar1 = h - uVar1;
  uVar11 = uVar9;
  if (h < w) {
    uVar11 = uVar1;
  }
  if (1 < (int)uVar11) {
    uVar2 = x + iVar7;
    uVar4 = (ulong)uVar2;
    uVar8 = iVar7 + y;
    iVar7 = -0x5a;
    if (w <= h) {
      iVar7 = 0;
    }
    iVar10 = 0xb4;
    if (h < w) {
      iVar10 = 0x5a;
    }
    iVar6 = 0x168;
    if (h < w) {
      iVar6 = 0x10e;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar7,fl_graphics_driver,(ulong)((uVar2 + uVar9) - uVar11),(ulong)uVar8,
               (ulong)uVar11,(ulong)uVar11);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar10,(double)iVar6,fl_graphics_driver,uVar4,
               (ulong)((uVar8 + uVar1) - uVar11),(ulong)uVar11,(ulong)uVar11);
    if (w < h) {
      uVar8 = (uVar11 >> 1) + uVar8;
      uVar1 = uVar1 - (uVar11 & 0x7ffffffe);
      pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    }
    else {
      if (w <= h) goto LAB_00198e69;
      uVar4 = (ulong)((uVar1 >> 1) + uVar2);
      uVar9 = uVar9 - (uVar1 & 0x7ffffffe);
      pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    }
    (*pp_Var5[4])(fl_graphics_driver,uVar4,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1);
  }
LAB_00198e69:
  FVar3 = fl_color_average(0x38,c,0.025);
  Fl::set_box_color(FVar3);
  iVar7 = x + 1;
  iVar10 = w + -2;
  draw(1,iVar7,y,iVar10,h,2);
  draw(1,x,y,w,h,3);
  FVar3 = fl_color_average(0x38,c,0.05);
  Fl::set_box_color(FVar3);
  draw(1,iVar7,y,iVar10,h,1);
  draw(1,x,y,w,h,2);
  FVar3 = fl_color_average(0x38,c,0.1);
  Fl::set_box_color(FVar3);
  draw(1,iVar7,y,iVar10,h,0);
  draw(1,x,y,w,h,1);
  FVar3 = fl_color_average(0xff,c,0.1);
  Fl::set_box_color(FVar3);
  draw(0,x,y,w,h,4);
  draw(0,iVar7,y,iVar10,h,3);
  FVar3 = fl_color_average(0xff,c,0.2);
  Fl::set_box_color(FVar3);
  draw(0,x,y,w,h,3);
  draw(0,iVar7,y,iVar10,h,2);
  FVar3 = fl_color_average(0xff,c,0.4);
  Fl::set_box_color(FVar3);
  draw(0,x,y,w,h,2);
  draw(0,iVar7,y,iVar10,h,1);
  FVar3 = fl_color_average(0xff,c,0.5);
  Fl::set_box_color(FVar3);
  draw(0,x,y,w,h,1);
  draw(0,iVar7,y,iVar10,h,0);
  FVar3 = fl_color_average(0x38,c,0.5);
  Fl::set_box_color(FVar3);
  draw(2,x,y,w,h,0);
  return;
}

Assistant:

static void gtk_round_up_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(c);
  draw(FILL,	    x,   y, w,   h, 2);

  gtk_color(fl_color_average(FL_BLACK, c, 0.025f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 2);
  draw(LOWER_RIGHT, x,   y, w,   h, 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 1);
  draw(LOWER_RIGHT, x,   y, w,   h, 2);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 0);
  draw(LOWER_RIGHT, x,   y, w,   h, 1);

  gtk_color(fl_color_average(FL_WHITE, c, 0.1f));
  draw(UPPER_LEFT,  x,   y, w,   h, 4);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.2f));
  draw(UPPER_LEFT,  x,   y, w,   h, 3);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 2);
  gtk_color(fl_color_average(FL_WHITE, c, 0.4f));
  draw(UPPER_LEFT,  x,   y, w,   h, 2);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 1);
  gtk_color(fl_color_average(FL_WHITE, c, 0.5f));
  draw(UPPER_LEFT,  x,   y, w,   h, 1);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 0);

  gtk_color(fl_color_average(FL_BLACK, c, 0.5f));
  draw(CLOSED,	    x,   y, w,   h, 0);
}